

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

void __thiscall
FStateDefinitions::ResolveGotoLabels
          (FStateDefinitions *this,PClassActor *actor,AActor *defaults,
          TArray<FStateDefine,_FStateDefine> *list)

{
  uint uVar1;
  FStateDefine *pFVar2;
  FState *pFVar3;
  uint local_2c;
  uint i;
  TArray<FStateDefine,_FStateDefine> *list_local;
  AActor *defaults_local;
  PClassActor *actor_local;
  FStateDefinitions *this_local;
  
  local_2c = 0;
  while( true ) {
    uVar1 = TArray<FStateDefine,_FStateDefine>::Size(list);
    if (uVar1 <= local_2c) break;
    pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)local_2c);
    if (pFVar2->State != (FState *)0x0) {
      pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)local_2c);
      if (pFVar2->DefineFlags == '\x04') {
        pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)local_2c);
        pFVar3 = ResolveGotoLabel(this,defaults,actor,(char *)pFVar2->State);
        pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)local_2c);
        pFVar2->State = pFVar3;
        pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)local_2c);
        pFVar2->DefineFlags = '\x01';
      }
    }
    pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)local_2c);
    uVar1 = TArray<FStateDefine,_FStateDefine>::Size(&pFVar2->Children);
    if (uVar1 != 0) {
      pFVar2 = TArray<FStateDefine,_FStateDefine>::operator[](list,(ulong)local_2c);
      ResolveGotoLabels(this,actor,defaults,&pFVar2->Children);
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void FStateDefinitions::ResolveGotoLabels (PClassActor *actor, AActor *defaults, TArray<FStateDefine> & list)
{
	for (unsigned i = 0; i < list.Size(); i++)
	{
		if (list[i].State != NULL && list[i].DefineFlags == SDF_LABEL)
		{ // It's not a valid state, so it must be a label string. Resolve it.
			list[i].State = ResolveGotoLabel (defaults, actor, (char *)list[i].State);
			list[i].DefineFlags = SDF_STATE;
		}
		if (list[i].Children.Size() > 0) ResolveGotoLabels(actor, defaults, list[i].Children);
	}
}